

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

void prvTidyCopyConfig(TidyDocImpl *docTo,TidyDocImpl *docFrom)

{
  Bool BVar1;
  undefined8 in_RAX;
  uint *in_RCX;
  TidyOptionImpl *option;
  ulong uVar2;
  TidyOptionValue *current;
  TidyOptionValue *oldval;
  uint changedUserTags;
  undefined8 uStack_38;
  
  if (docTo != docFrom) {
    current = (docFrom->config).value;
    oldval = (docTo->config).value;
    uStack_38 = in_RAX;
    BVar1 = NeedReparseTagDecls((TidyDocImpl *)oldval,current,
                                (TidyOptionValue *)((long)&uStack_38 + 4),in_RCX);
    prvTidyTakeConfigSnapshot(docTo);
    option = option_defs;
    uVar2 = 0;
    do {
      if (uVar2 != option->id) {
        __assert_fail("ixVal == (uint) option->id",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                      ,0x2f8,"void prvTidyCopyConfig(TidyDocImpl *, TidyDocImpl *)");
      }
      CopyOptionValue(docTo,option,oldval,current);
      option = option + 1;
      uVar2 = uVar2 + 1;
      oldval = oldval + 1;
      current = current + 1;
    } while (uVar2 != 0x68);
    if (BVar1 != no) {
      ReparseTagDecls(docTo,uStack_38._4_4_);
    }
    AdjustConfig(docTo);
  }
  return;
}

Assistant:

void TY_(CopyConfig)( TidyDocImpl* docTo, TidyDocImpl* docFrom )
{
    if ( docTo != docFrom )
    {
        uint ixVal;
        const TidyOptionImpl* option = option_defs;
        const TidyOptionValue* from = &docFrom->config.value[ 0 ];
        TidyOptionValue* to   = &docTo->config.value[ 0 ];
        uint changedUserTags;
        Bool needReparseTagsDecls = NeedReparseTagDecls( docTo, to, from,
                                                         &changedUserTags );

        TY_(TakeConfigSnapshot)( docTo );
        for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
        {
            assert( ixVal == (uint) option->id );
            CopyOptionValue( docTo, option, &to[ixVal], &from[ixVal] );
        }
        if ( needReparseTagsDecls )
            ReparseTagDecls( docTo, changedUserTags  );
        AdjustConfig( docTo );  /* Make sure it's consistent */
    }
}